

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EM.cpp
# Opt level: O2

void __thiscall EM::em_alg(EM *this,int cl)

{
  pointer plVar1;
  double *pdVar2;
  pointer pdVar3;
  pointer pvVar4;
  double *pdVar5;
  pointer pvVar6;
  pointer pvVar7;
  int iVar8;
  uint uVar9;
  int i_2;
  long lVar10;
  long lVar11;
  ulong uVar12;
  size_type __n;
  EM *pEVar13;
  ulong uVar14;
  int j;
  ulong uVar15;
  long lVar16;
  int i;
  uint uVar17;
  long lVar18;
  int i_1;
  long lVar19;
  longdouble in_ST0;
  longdouble lVar20;
  longdouble lVar21;
  longdouble in_ST1;
  longdouble lVar22;
  longdouble lVar23;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  double dVar24;
  double dVar25;
  initializer_list<double> __l;
  initializer_list<double> __l_00;
  initializer_list<double> __l_01;
  initializer_list<double> __l_02;
  double local_298;
  EM *local_290;
  ulong local_288;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  l;
  pointer local_268;
  undefined2 uStack_260;
  vector<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
  X;
  vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  Rtmp;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  C;
  vector<double,_std::allocator<double>_> Wtmp;
  vector<double,_std::allocator<double>_> W;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  Y;
  longdouble local_1b0;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  Ctmp;
  vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  R;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  r;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_f0;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_d8;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_c0;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_a8;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_90;
  vector<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
  local_78;
  
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&Y,(long)this->points_nmb,(allocator_type *)&C);
  lVar10 = 0;
  for (lVar18 = 0; lVar18 < this->points_nmb; lVar18 = lVar18 + 1) {
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)
               ((long)&((Y.
                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start + lVar10),
               (value_type_conflict1 *)
               ((long)&((this->f).all_points.super__Vector_base<Point,_std::allocator<Point>_>.
                        _M_impl.super__Vector_impl_data._M_start)->x + lVar10));
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)
               ((long)&((Y.
                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start + lVar10),
               (value_type_conflict1 *)
               ((long)&((this->f).all_points.super__Vector_base<Point,_std::allocator<Point>_>.
                        _M_impl.super__Vector_impl_data._M_start)->y + lVar10));
    lVar10 = lVar10 + 0x18;
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&C,2,(allocator_type *)&R);
  __n = (size_type)cl;
  uVar17 = 0;
  uVar9 = 0;
  if (0 < cl) {
    uVar9 = cl;
  }
  local_290 = this;
  for (; uVar17 != uVar9; uVar17 = uVar17 + 1) {
    for (lVar10 = 0; lVar10 != 2; lVar10 = lVar10 + 1) {
      std::vector<double,_std::allocator<double>_>::resize
                (C.
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + lVar10,__n);
      for (uVar15 = 0; (uint)cl != uVar15; uVar15 = uVar15 + 1) {
        iVar8 = rand();
        C.
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[lVar10].
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
        [uVar15] = (double)(iVar8 % 1000) / 1000.0;
      }
    }
  }
  std::
  vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  ::vector(&R,__n,(allocator_type *)&W);
  local_288 = (ulong)uVar9;
  lVar10 = local_288 * 0x18;
  for (lVar18 = 0;
      pvVar7 = R.
               super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start, lVar10 != lVar18; lVar18 = lVar18 + 0x18)
  {
    X.
    super__Vector_base<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)&DAT_3ff0000000000000;
    X.
    super__Vector_base<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    __l._M_len = 2;
    __l._M_array = (iterator)&X;
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)
               &W.super__Vector_base<double,_std::allocator<double>_>,__l,(allocator_type *)&Ctmp);
    std::
    vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>
    ::emplace_back<std::vector<double,std::allocator<double>>>
              ((vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>
                *)((long)&(pvVar7->
                          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + lVar18),
               (vector<double,_std::allocator<double>_> *)
               &W.super__Vector_base<double,_std::allocator<double>_>);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&W.super__Vector_base<double,_std::allocator<double>_>);
    pvVar7 = R.
             super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    X.
    super__Vector_base<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)&DAT_3ff0000000000000;
    X.
    super__Vector_base<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    __l_00._M_len = 2;
    __l_00._M_array = (iterator)&X;
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)
               &W.super__Vector_base<double,_std::allocator<double>_>,__l_00,(allocator_type *)&Ctmp
              );
    std::
    vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>
    ::emplace_back<std::vector<double,std::allocator<double>>>
              ((vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>
                *)((long)&(pvVar7->
                          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + lVar18),
               (vector<double,_std::allocator<double>_> *)
               &W.super__Vector_base<double,_std::allocator<double>_>);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&W.super__Vector_base<double,_std::allocator<double>_>);
  }
  std::vector<double,_std::allocator<double>_>::vector(&W,__n,(allocator_type *)&X);
  for (uVar15 = 0; local_288 != uVar15; uVar15 = uVar15 + 1) {
    W.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
    [uVar15] = 1.0 / (double)cl;
  }
  iVar8 = local_290->points_nmb;
  Wtmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._0_10_ =
       (BADTYPE)0;
  std::vector<long_double,_std::allocator<long_double>_>::vector
            ((vector<long_double,_std::allocator<long_double>_> *)&Ctmp,__n,
             (value_type_conflict3 *)&Wtmp,(allocator_type *)&Rtmp);
  std::
  vector<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
  ::vector(&X,(long)iVar8,(value_type *)&Ctmp,(allocator_type *)&l);
  std::_Vector_base<long_double,_std::allocator<long_double>_>::~_Vector_base
            ((_Vector_base<long_double,_std::allocator<long_double>_> *)&Ctmp);
  lVar18 = local_288 * 8;
  uVar9 = 0;
  lVar20 = (longdouble)0;
  lVar22 = (longdouble)2.1;
  while( true ) {
    if ((ABS(lVar22 - lVar20) < (longdouble)0.1) || (0x31 < uVar9)) break;
    Rtmp.
    super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    lVar20 = in_ST4;
    lVar23 = in_ST4;
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)
               &Wtmp.super__Vector_base<double,_std::allocator<double>_>,__n,
               (value_type_conflict1 *)&Rtmp,(allocator_type *)&l);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::vector(&Ctmp,2,(value_type *)&Wtmp.super__Vector_base<double,_std::allocator<double>_>,
             (allocator_type *)&r);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&Wtmp.super__Vector_base<double,_std::allocator<double>_>);
    Rtmp.
    super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)
               &Wtmp.super__Vector_base<double,_std::allocator<double>_>,__n,
               (value_type_conflict1 *)&Rtmp,(allocator_type *)&l);
    std::
    vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
    ::vector(&Rtmp,__n,(allocator_type *)&l);
    uVar9 = uVar9 + 1;
    for (lVar11 = 0;
        pvVar7 = Rtmp.
                 super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start, lVar10 != lVar11; lVar11 = lVar11 + 0x18
        ) {
      r.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      r.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      __l_01._M_len = 2;
      __l_01._M_array = (iterator)&r;
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)&l,__l_01,(allocator_type *)&local_298);
      std::
      vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>
      ::emplace_back<std::vector<double,std::allocator<double>>>
                ((vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>
                  *)((long)&(pvVar7->
                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + lVar11),
                 (vector<double,_std::allocator<double>_> *)&l);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                ((_Vector_base<double,_std::allocator<double>_> *)&l);
      pvVar7 = Rtmp.
               super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      r.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      r.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      __l_02._M_len = 2;
      __l_02._M_array = (iterator)&r;
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)&l,__l_02,(allocator_type *)&local_298);
      std::
      vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>
      ::emplace_back<std::vector<double,std::allocator<double>>>
                ((vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>
                  *)((long)&(pvVar7->
                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + lVar11),
                 (vector<double,_std::allocator<double>_> *)&l);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                ((_Vector_base<double,_std::allocator<double>_> *)&l);
    }
    lVar11 = 0;
    local_1b0 = (longdouble)0;
    while( true ) {
      uVar15 = (ulong)local_290->points_nmb;
      uVar12 = 0;
      if ((long)uVar15 <= lVar11) break;
      local_268 = SUB108((longdouble)0,0);
      uStack_260 = (undefined2)((unkuint10)(longdouble)0 >> 0x40);
      for (; uVar12 != local_288; uVar12 = uVar12 + 1) {
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::vector(&l,2,(allocator_type *)&r);
        lVar19 = 0;
        lVar21 = in_ST0;
        in_ST0 = in_ST1;
        in_ST1 = in_ST2;
        in_ST2 = in_ST3;
        in_ST3 = in_ST4;
        in_ST4 = lVar20;
        lVar20 = lVar23;
        for (lVar16 = 0; lVar16 != 2; lVar16 = lVar16 + 1) {
          r.
          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)(Y.
                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[lVar11].
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar16] -
                        *(double *)
                         (*(long *)((long)&((C.
                                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->
                                           super__Vector_base<double,_std::allocator<double>_>).
                                           _M_impl.super__Vector_impl_data._M_start + lVar19) +
                         uVar12 * 8));
          std::vector<double,_std::allocator<double>_>::emplace_back<double>
                    ((vector<double,_std::allocator<double>_> *)
                     ((long)&((l.
                               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                             super__Vector_impl_data._M_start + lVar19),(double *)&r);
          lVar19 = lVar19 + 0x18;
        }
        pEVar13 = (EM *)&l;
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::vector(&local_a8,
                 (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  *)pEVar13);
        matrix_transporation(&local_f0,pEVar13,&local_a8);
        pEVar13 = (EM *)(R.
                         super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + uVar12);
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::vector(&local_d8,
                 (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  *)pEVar13);
        matrix_reversal(&local_c0,pEVar13,&local_d8);
        matrix_composition(&local_90,pEVar13,&local_f0,&local_c0);
        pEVar13 = (EM *)&l;
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  *)&stack0xffffffffffffffb8,
                 (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  *)pEVar13);
        matrix_composition(&r,pEVar13,&local_90,
                           (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            *)&stack0xffffffffffffffb8);
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::~vector(&r);
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   *)&stack0xffffffffffffffb8);
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::~vector(&local_90);
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::~vector(&local_c0);
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::~vector(&local_d8);
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::~vector(&local_f0);
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::~vector(&local_a8);
        dVar25 = W.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar12];
        expl();
        pEVar13 = (EM *)&stack0xffffffffffffffa0;
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  *)&stack0xffffffffffffffa0,
                 R.
                 super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar12);
        dVar24 = determinat(pEVar13,(vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                     *)&stack0xffffffffffffffa0);
        if (dVar24 < 0.0) {
          dVar24 = sqrt(dVar24);
        }
        else {
          dVar24 = SQRT(dVar24);
        }
        X.
        super__Vector_base<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[lVar11].
        super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
        super__Vector_impl_data._M_start[uVar12] =
             ((lVar21 * (longdouble)dVar25) / (longdouble)2.5066282731988805) / (longdouble)dVar24;
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   *)&stack0xffffffffffffffa0);
        lVar23 = (longdouble)CONCAT28(uStack_260,local_268) +
                 X.
                 super__Vector_base<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar11].
                 super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar12];
        local_268 = SUB108(lVar23,0);
        uStack_260 = (undefined2)((unkuint10)lVar23 >> 0x40);
        lVar23 = lVar20;
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::~vector(&l);
      }
      for (lVar16 = 0; lVar18 != lVar16; lVar16 = lVar16 + 8) {
        plVar1 = X.
                 super__Vector_base<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar11].
                 super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar23 = *(longdouble *)((long)plVar1 + lVar16 * 2) /
                 (longdouble)CONCAT28(uStack_260,local_268);
        *(longdouble *)((long)plVar1 + lVar16 * 2) = lVar23;
        *(double *)
         ((long)Wtmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start + lVar16) =
             (double)(lVar23 + (longdouble)
                               *(double *)
                                ((long)Wtmp.super__Vector_base<double,_std::allocator<double>_>.
                                       _M_impl.super__Vector_impl_data._M_start + lVar16));
        pdVar2 = Y.
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar11].
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        pdVar3 = ((Ctmp.
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->
                 super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        *(double *)((long)pdVar3 + lVar16) =
             (double)(lVar23 * (longdouble)*pdVar2 + (longdouble)*(double *)((long)pdVar3 + lVar16))
        ;
        pdVar3 = Ctmp.
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[1].
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        *(double *)((long)pdVar3 + lVar16) =
             (double)(lVar23 * (longdouble)pdVar2[1] +
                     (longdouble)*(double *)((long)pdVar3 + lVar16));
        lVar23 = lVar20;
      }
      logl();
      local_1b0 = local_1b0 + in_ST0;
      lVar11 = lVar11 + 1;
      in_ST0 = in_ST1;
      in_ST1 = in_ST2;
      in_ST2 = in_ST3;
      in_ST3 = in_ST4;
      in_ST4 = lVar20;
      lVar20 = lVar23;
    }
    for (; uVar12 != local_288; uVar12 = uVar12 + 1) {
      for (lVar11 = 0; lVar11 != 0x30; lVar11 = lVar11 + 0x18) {
        *(double *)
         (*(long *)((long)&((C.
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data._M_start + lVar11) + uVar12 * 8) =
             *(double *)
              (*(long *)((long)&((Ctmp.
                                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->
                                super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                super__Vector_impl_data._M_start + lVar11) + uVar12 * 8) /
             Wtmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar12];
      }
      lVar11 = 0;
      while( true ) {
        if ((int)uVar15 <= lVar11) break;
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::vector(&l,2,(allocator_type *)&r);
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::vector(&r,2,(allocator_type *)&local_298);
        lVar16 = 0;
        for (lVar19 = 0; lVar19 != 2; lVar19 = lVar19 + 1) {
          local_298 = (double)(X.
                               super__Vector_base<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[lVar11].
                               super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl
                               .super__Vector_impl_data._M_start[uVar12] *
                              (longdouble)
                              (Y.
                               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[lVar11].
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start[lVar19] -
                              *(double *)
                               (*(long *)((long)&((C.
                                                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                 super__Vector_base<double,_std::allocator<double>_>
                                                 )._M_impl.super__Vector_impl_data._M_start + lVar16
                                         ) + uVar12 * 8)));
          std::vector<double,_std::allocator<double>_>::emplace_back<double>
                    ((vector<double,_std::allocator<double>_> *)
                     ((long)&((l.
                               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                             super__Vector_impl_data._M_start + lVar16),&local_298);
          local_298 = Y.
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[lVar11].
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar19] -
                      *(double *)
                       (*(long *)((long)&((C.
                                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->
                                         super__Vector_base<double,_std::allocator<double>_>).
                                         _M_impl.super__Vector_impl_data._M_start + lVar16) +
                       uVar12 * 8);
          std::vector<double,_std::allocator<double>_>::emplace_back<double>
                    ((vector<double,_std::allocator<double>_> *)
                     ((long)&((r.
                               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                             super__Vector_impl_data._M_start + lVar16),&local_298);
          lVar16 = lVar16 + 0x18;
        }
        pdVar2 = Y.
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar11].
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        dVar25 = *pdVar2 - ((C.
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data._M_start[uVar12];
        lVar20 = X.
                 super__Vector_base<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar11].
                 super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar12];
        pvVar4 = Rtmp.
                 super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar12].
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pdVar5 = (pvVar4->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        *pdVar5 = (double)(lVar20 * (longdouble)(dVar25 * dVar25) + (longdouble)*pdVar5);
        dVar25 = pdVar2[1] -
                 C.
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[1].
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[uVar12];
        lVar16 = *(long *)&pvVar4[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data;
        *(double *)(lVar16 + 8) =
             (double)(lVar20 * (longdouble)(dVar25 * dVar25) + (longdouble)*(double *)(lVar16 + 8));
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::~vector(&r);
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::~vector(&l);
        lVar11 = lVar11 + 1;
        uVar15 = (ulong)(uint)local_290->points_nmb;
      }
      for (uVar14 = 0; (uint)cl != uVar14; uVar14 = uVar14 + 1) {
        W.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar14] =
             Wtmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar14] / (double)(int)uVar15;
      }
      pvVar4 = Rtmp.
               super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar12].
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pvVar6 = R.
               super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar12].
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(pvVar6->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data
       ._M_start = *(pvVar4->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start /
                   Wtmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar12];
      *(double *)
       (*(long *)&pvVar6[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data + 8) =
           *(double *)
            (*(long *)&pvVar4[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data + 8) /
           Wtmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start[uVar12];
    }
    std::
    vector<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
    ::vector(&local_78,&X);
    make_clusters(local_290,&local_78,cl);
    std::
    vector<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
    ::~vector(&local_78);
    std::
    vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
    ::~vector(&Rtmp);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&Wtmp.super__Vector_base<double,_std::allocator<double>_>);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector(&Ctmp);
    lVar20 = lVar22;
    lVar22 = local_1b0;
  }
  std::
  vector<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
  ::~vector(&X);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&W.super__Vector_base<double,_std::allocator<double>_>);
  std::
  vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  ::~vector(&R);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&C);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&Y);
  return;
}

Assistant:

void EM:: em_alg(int cl) {
    int dim=2;
    double e=0.1;
    int Q=0;
    vector<vector<double>> Y(points_nmb);//xi
    for(int i=0;i<points_nmb;i++)//point_nmb*dim
    {
        Y[i].push_back(f.all_points[i].x);
        Y[i].push_back(f.all_points[i].y);
    }


    vector<vector<double>> C(dim);//mathematical expectation

    for(int i=0;i<cl;i++) {
        for (int i = 0; i < 2; i++) {
            C[i].resize(cl);

            for (int j = 0; j < cl; j++) {
                C[i][j] = (double)(rand() % 1000)/1000;

            }
        }
    }


    vector<vector<vector<double>>> R(cl);//sigma covariation matrix

    for(int i=0;i<cl;i++) {
        R[i].push_back({1,0});
        R[i].push_back({0,1});

    }


    vector<double> W(cl);

    for(int i=0;i<cl;i++) {
        W[i] = (double) 1 / cl;
    }


    vector<vector<long double>>X(points_nmb, vector<long double>(cl, 0));



    long double llh=0,llh2=e+2;
    long double sumpi=0;

    //start cycle
    while(fabs(llh2-llh)>=e and Q<50)
    {
        vector <vector <double> > Ctmp (dim, vector<double>(cl, 0));

        vector <double> Wtmp(cl, 0);

        Q++;
        llh=llh2;
        vector<vector<vector<double>>> Rtmp(cl);

        for(int i=0;i<cl;i++) {
            Rtmp[i].push_back({0,0});
            Rtmp[i].push_back({0,0});

        }

        llh2=0;
        for(int i=0;i<points_nmb;i++)
        {

            sumpi=0;
            for(int j=0;j<cl;j++)
            {
                vector<vector<double>> l(dim);

                for(int k=0;k<dim;k++)
                {
                    l[k].push_back(Y[i][k]-C[k][j]);

                }
                double sigma=matrix_composition(matrix_composition(matrix_transporation(l),matrix_reversal(R[j])),l)[0][0];//scalar product- mahalanobis distination
                X[i][j] = (long double)W[j] * expl((long double)-sigma/2)/sqrt(2*PI)/sqrt(determinat(R[j]));
                sumpi+=X[i][j];//found p(x)

            }
            for(int j=0;j<cl;j++) {
                X[i][j]/= sumpi;
                Wtmp[j]+=X[i][j];
                Ctmp[0][j]+= Y[i][0] * X[i][j];
                Ctmp[1][j]+=Y[i][1] * X[i][j];
            }

            llh2=llh2+log(sumpi);

        }

        for(int j=0;j<cl;j++)
        {
            for(int k=0;k<dim;k++)
            {
                C[k][j]=Ctmp[k][j]/Wtmp[j];
            }


            for(int i=0;i<points_nmb;i++)
            {
                vector<vector<double>> l(dim);
                vector<vector<double>> r(dim);
                for(int k=0;k<dim;k++)
                {
                    l[k].push_back((Y[i][k]-C[k][j])*X[i][j]);
                    r[k].push_back((Y[i][k]-C[k][j]));
                }

                Rtmp[j][0][0]+=(Y[i][0]-C[0][j])*(Y[i][0]-C[0][j])*X[i][j];
                Rtmp[j][1][1]+=(Y[i][1]-C[1][j])*(Y[i][1]-C[1][j])*X[i][j];
            }
            for (int i = 0; i < cl; i++) {
                W[i] = Wtmp[i]/points_nmb;
            }
            R[j][0][0] = Rtmp[j][0][0]/Wtmp[j];
            R[j][1][1] = Rtmp[j][1][1]/Wtmp[j];

        }
        make_clusters(X,cl);


    }



}